

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_candlestick.c
# Opt level: O1

ErrorNumber test_candlestick(TA_History *history)

{
  ErrorNumber EVar1;
  TA_RetCode TVar2;
  ulong uVar3;
  TA_Test *pTVar4;
  ulong uVar5;
  TA_Test *local_60;
  TA_Real *local_58;
  TA_Real *pTStack_50;
  TA_Real *local_48;
  TA_Real *pTStack_40;
  TA_ParamHolder *local_38;
  
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,20000);
  pTVar4 = tableTest;
  uVar5 = 0;
  do {
    clearAllBuffers();
    setInputBuffer(0,history->open,history->nbBars);
    setInputBuffer(1,history->high,history->nbBars);
    setInputBuffer(2,history->low,history->nbBars);
    setInputBuffer(3,history->close,history->nbBars);
    local_58 = history->open;
    pTStack_50 = history->high;
    local_48 = history->low;
    pTStack_40 = history->close;
    local_38 = (TA_ParamHolder *)0x0;
    local_60 = pTVar4;
    if (pTVar4->doRangeTestFlag == 0) {
LAB_00113e33:
      uVar3 = 0;
    }
    else {
      EVar1 = doRangeTest(rangeTestFunction,TA_FUNC_UNST_NONE,&local_60,1,0);
      uVar3 = (ulong)EVar1;
      if ((local_38 == (TA_ParamHolder *)0x0) ||
         (TVar2 = TA_ParamHolderFree(local_38), TVar2 == TA_SUCCESS)) {
        if (EVar1 == TA_TEST_PASS) goto LAB_00113e33;
      }
      else {
        printf("TA_ParamHolderFree failed [%d]\n");
        uVar3 = 0x38d;
      }
    }
    if ((ErrorNumber)uVar3 != TA_TEST_PASS) {
      printf("Failed Test #%d for %s (retValue=%d)\n",uVar5 & 0xffffffff,pTVar4->name,uVar3);
      return (ErrorNumber)uVar3;
    }
    uVar5 = uVar5 + 1;
    pTVar4 = pTVar4 + 1;
    if (uVar5 == 0x3d) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_candlestick( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Initialize all the unstable period with a large number that would
    * break the logic if a candlestick unexpectably use a function affected
    * by an unstable period.
    */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 20000 );

   /* Perform sequentialy all the tests. */
   for( i=0; i < NB_TEST; i++ )
   {
      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "Failed Test #%d for %s (retValue=%d)\n", i, tableTest[i].name, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All tests succeed. */
   return TA_TEST_PASS;
}